

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_byte_string(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                 *this,byte_string_type *v,error_code *ec)

{
  byte bVar1;
  pointer puVar2;
  byte *pbVar3;
  pointer pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  assertion_error *this_00;
  size_t length;
  ulong uVar6;
  ulong uVar7;
  anon_class_8_1_54a39816 func;
  undefined1 local_68 [64];
  
  puVar2 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if ((this->source_).buffer_length_ == 0) {
    stream_source<unsigned_char>::fill_buffer(&this->source_);
    if ((this->source_).buffer_length_ == 0) goto LAB_00263cc1;
  }
  pbVar3 = (this->source_).buffer_data_;
  bVar1 = *pbVar3;
  length = CONCAT71((int7)((ulong)pbVar3 >> 8),bVar1) & 0xffffffe0;
  if ((char)length != '@') {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::byte_string\' failed at  <> :0"
               ,"");
    assertion_error::assertion_error(this_00,(string *)local_68);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((~bVar1 & 0x1f) == 0) {
    local_68._0_8_ = v;
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
    iterate_string_chunks<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::error_code&)::_lambda(jsoncons::stream_source<unsigned_char>&,unsigned_long,std::error_code&)_1_>
              ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
               this,(anon_class_8_1_54a39816 *)local_68,byte_string,ec);
  }
  else {
    v_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)get_uint64_value(this,ec);
    if (ec->_M_value == 0) {
      pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               source_reader<jsoncons::stream_source<unsigned_char>>::
               read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((source_reader<jsoncons::stream_source<unsigned_char>> *)&this->source_,
                          (stream_source<unsigned_char> *)v,v_00,length);
      if (pvVar5 != v_00) {
LAB_00263cc1:
        std::error_code::operator=(ec,unexpected_eof);
        return;
      }
      pvVar4 = (this->stringref_map_stack_).
               super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->stringref_map_stack_).
          super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pvVar4) {
        uVar6 = (long)pvVar4[-1].
                      super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)pvVar4[-1].
                      super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6;
        uVar7 = 3;
        if (((0x17 < uVar6) && (uVar7 = 4, 0xff < uVar6)) && (uVar7 = 5, 0xffff < uVar6)) {
          uVar7 = (ulong)(uVar6 >> 0x20 != 0) * 4 + 7;
        }
        if (uVar7 <= (ulong)((long)(v->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(v->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start)) {
          mapped_string::mapped_string
                    ((mapped_string *)local_68,v,(allocator_type *)&this->field_0x28);
          std::
          vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>>
          ::
          emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>
                    ((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>>
                      *)(pvVar4 + -1),(mapped_string *)local_68);
          mapped_string::~mapped_string((mapped_string *)local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void read_byte_string(byte_string_type& v, std::error_code& ec)
    {
        v.clear();
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::byte_string);

        switch(info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                auto func = [&v](Source& source, std::size_t length, std::error_code& ec) -> bool
                {
                    if (source_reader<Source>::read(source, v, length) != length)
                    {
                        ec = cbor_errc::unexpected_eof;
                        return false;
                    }
                    return true;
                };
                iterate_string_chunks(func, major_type, ec);
                break;
            }
            default:
            {
                std::size_t length = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (source_reader<Source>::read(source_, v, length) != length)
                {
                    ec = cbor_errc::unexpected_eof;
                    return;
                }
                if (!stringref_map_stack_.empty() &&
                    v.size() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
                {
                    stringref_map_stack_.back().emplace_back(mapped_string(v, alloc_));
                }
                break;
            }

        }
    }